

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzer.cpp
# Opt level: O1

bool __thiscall SMBusAnalyzer::GetSignal(SMBusAnalyzer *this,SMBusSignalState *state)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  AnalyzerChannelData *pAVar4;
  long lVar5;
  U64 UVar6;
  long lVar7;
  ulong uVar8;
  byte unaff_BPL;
  byte bVar9;
  ulong uVar10;
  
  do {
    state->sample_marker = 0;
    state->sample_rising_clk = 0;
    state->sample_begin = 0;
    state->sample_end = 0;
    state->bus_signal = SMB_Undefined;
    pAVar4 = GetNearestTransitionChannel(this);
    iVar3 = AnalyzerChannelData::GetBitState();
    bVar9 = 1;
    if (iVar3 == 1) {
      lVar5 = AnalyzerChannelData::GetSampleNumber();
      if (pAVar4 == this->mSMBDAT) {
        lVar7 = AnalyzerChannelData::GetSampleNumber();
        UVar6 = AnalyzerChannelData::GetSampleOfNextEdge();
        state->sample_marker = UVar6;
        iVar3 = AnalyzerChannelData::GetBitState();
        state->bus_signal = (uint)(iVar3 != 1);
        pAVar4 = AdvanceAllTo(this,state->sample_marker);
        cVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
        if (cVar2 == '\0') {
          uVar10 = state->sample_marker - lVar7;
        }
        else {
          lVar7 = AnalyzerChannelData::GetSampleOfNextEdge();
          uVar8 = lVar7 - state->sample_marker;
          uVar10 = state->sample_marker - lVar5;
          if (uVar8 < uVar10) {
            uVar10 = uVar8;
          }
          uVar10 = uVar10 >> 1;
        }
        state->sample_begin = state->sample_marker - uVar10;
        state->sample_end = state->sample_marker + uVar10;
        if ((state->bus_signal == SMB_Start) && (pAVar4 == this->mSMBCLK)) {
          UVar6 = AnalyzerChannelData::GetSampleOfNextEdge();
          AdvanceAllTo(this,UVar6);
        }
        bVar9 = 0;
      }
      else {
        UVar6 = AnalyzerChannelData::GetSampleOfNextEdge();
        pAVar4 = AdvanceAllTo(this,UVar6);
      }
    }
    if (bVar9 == 0) {
LAB_0010a3f5:
      bVar1 = false;
      unaff_BPL = bVar9;
    }
    else {
      iVar3 = AnalyzerChannelData::GetBitState();
      if (iVar3 != 0) {
        __assert_fail("mSMBCLK->GetBitState() == BIT_LOW",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/saleae[P]smbus-analyzer/src/SMBusAnalyzer.cpp"
                      ,0x8d,"bool SMBusAnalyzer::GetSignal(SMBusSignalState &)");
      }
      if (pAVar4 == this->mSMBDAT) {
        UVar6 = AnalyzerChannelData::GetSampleOfNextEdge();
        state->sample_begin = UVar6;
        pAVar4 = AdvanceAllTo(this,UVar6);
      }
      else {
        lVar5 = AnalyzerChannelData::GetSampleNumber();
        lVar7 = AnalyzerChannelData::GetSampleOfNextEdge();
        state->sample_begin = (ulong)(lVar7 + lVar5) >> 1;
      }
      bVar1 = true;
      if (pAVar4 == this->mSMBCLK) {
        UVar6 = AnalyzerChannelData::GetSampleOfNextEdge();
        pAVar4 = AdvanceAllTo(this,UVar6);
        UVar6 = AnalyzerChannelData::GetSampleNumber();
        state->sample_rising_clk = UVar6;
        if (pAVar4 == this->mSMBCLK) {
          lVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
          uVar10 = lVar5 + state->sample_rising_clk >> 1;
          state->sample_marker = uVar10;
          if (state->sample_rising_clk < uVar10) {
            uVar8 = AnalyzerChannelData::GetSampleOfNextEdge();
            if (uVar10 < uVar8) {
              AdvanceAllTo(this,state->sample_marker);
            }
          }
          iVar3 = AnalyzerChannelData::GetBitState();
          state->bus_signal = iVar3 == 1 | SMB_Zero;
          UVar6 = AnalyzerChannelData::GetSampleOfNextEdge();
          pAVar4 = AdvanceAllTo(this,UVar6);
          if (pAVar4 == this->mSMBCLK) {
            lVar5 = AnalyzerChannelData::GetSampleNumber();
            lVar7 = AnalyzerChannelData::GetSampleOfNextEdge();
            uVar10 = (ulong)(lVar7 + lVar5) >> 1;
          }
          else {
            uVar10 = AnalyzerChannelData::GetSampleOfNextEdge();
          }
          state->sample_end = uVar10;
          goto LAB_0010a3f5;
        }
      }
    }
    if (!bVar1) {
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

bool SMBusAnalyzer::GetSignal( SMBusSignalState& state )
{
func_begin:

    bool ret_val = true;

    state.Clear();

    AnalyzerChannelData* nearestEdgeChannel = GetNearestTransitionChannel();

    // first check for a start or stop
    if( mSMBCLK->GetBitState() == BIT_HIGH )
    {
        U64 start_sample = mSMBCLK->GetSampleNumber();
        if( nearestEdgeChannel == mSMBDAT )
        {
            ret_val = false;

            // remember where we began in case this is the last packet
            U64 frame_begin = mSMBDAT->GetSampleNumber();

            state.sample_marker = mSMBDAT->GetSampleOfNextEdge();

            if( mSMBDAT->GetBitState() == BIT_HIGH )
                state.bus_signal = SMB_Start;
            else
                state.bus_signal = SMB_Stop;

            // move all to the SMBDAT transition
            nearestEdgeChannel = AdvanceAllTo( state.sample_marker );

            // set the begin and ending samples for the frame
            U64 frame_offset = 0;
            if( nearestEdgeChannel->DoMoreTransitionsExistInCurrentData() )
            {
                U64 end_sample = nearestEdgeChannel->GetSampleOfNextEdge();
                if( end_sample - state.sample_marker < state.sample_marker - start_sample )
                    frame_offset = ( end_sample - state.sample_marker ) / 2;
                else
                    frame_offset = ( state.sample_marker - start_sample ) / 2;
            }
            else
            {
                frame_offset = state.sample_marker - frame_begin;
            }

            state.sample_begin = state.sample_marker - frame_offset;
            state.sample_end = state.sample_marker + frame_offset;

            // skip the falling SMBCLK if we have a start
            // this prepares us for the first bit
            if( state.bus_signal == SMB_Start && nearestEdgeChannel == mSMBCLK )
                AdvanceAllTo( mSMBCLK->GetSampleOfNextEdge() );
        }
        else
        {
            // SMBCLK falls - skip to it
            nearestEdgeChannel = AdvanceAllTo( nearestEdgeChannel->GetSampleOfNextEdge() );
        }
    }

    // if we didn't find a start or stop above try parsing a bit
    if( ret_val )
    {
        // we must have a low SMBCLK at this point
        assert( mSMBCLK->GetBitState() == BIT_LOW );

        // skip the preparing of SMBDAT for the rising SMBCLK egde
        if( nearestEdgeChannel == mSMBDAT )
        {
            state.sample_begin = mSMBDAT->GetSampleOfNextEdge();
            nearestEdgeChannel = AdvanceAllTo( state.sample_begin );
        }
        else
        {
            state.sample_begin = ( mSMBCLK->GetSampleNumber() + mSMBCLK->GetSampleOfNextEdge() ) / 2;
        }

        // do we have a rising SMBCLK at this point?
        if( nearestEdgeChannel == mSMBCLK )
        {
            nearestEdgeChannel = AdvanceAllTo( mSMBCLK->GetSampleOfNextEdge() );

            state.sample_rising_clk = mSMBCLK->GetSampleNumber();

            // do we have a falling SMBCLK edge next?
            if( nearestEdgeChannel == mSMBCLK )
            {
                // sample the state of SMBDAT
                state.sample_marker = ( mSMBCLK->GetSampleOfNextEdge() + state.sample_rising_clk ) / 2;

                if( state.sample_marker > state.sample_rising_clk && state.sample_marker < mSMBCLK->GetSampleOfNextEdge() )
                    nearestEdgeChannel = AdvanceAllTo( state.sample_marker );

                state.bus_signal = mSMBDAT->GetBitState() == BIT_HIGH ? SMB_One : SMB_Zero;

                // advance to SMBCLK falling edge
                nearestEdgeChannel = AdvanceAllTo( mSMBCLK->GetSampleOfNextEdge() );

                // where to put the end of state depends on where the next transition happens
                if( nearestEdgeChannel == mSMBCLK )
                    state.sample_end = ( mSMBCLK->GetSampleNumber() + mSMBCLK->GetSampleOfNextEdge() ) / 2;
                else
                    state.sample_end = mSMBDAT->GetSampleOfNextEdge();
            }
            else
            {
                // go back to parsing start/stop
                goto func_begin;
            }
        }
        else
        {
            // go back to parsing start/stop
            goto func_begin;
        }
    }

    return ret_val;
}